

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QLineF * __thiscall QVariant::toLineF(QVariant *this)

{
  QLineF *in_RDI;
  QVariant *unaff_retaddr;
  
  qvariant_cast<QLineF>(unaff_retaddr);
  return in_RDI;
}

Assistant:

QLineF QVariant::toLineF() const
{
    return qvariant_cast<QLineF>(*this);
}